

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O2

void __thiscall amrex::Cluster::distribute(Cluster *this,ClusterList *clst,BoxDomain *bd)

{
  pointer pBVar1;
  Cluster *this_00;
  Box *b;
  
  b = (bd->super_BoxList).m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start;
  pBVar1 = (bd->super_BoxList).m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while (((b != pBVar1 && (this->m_ar != (IntVect *)0x0)) && (0 < this->m_len))) {
    this_00 = (Cluster *)operator_new(0x30);
    Cluster(this_00,this,b);
    if ((this_00->m_ar == (IntVect *)0x0) || (this_00->m_len < 1)) {
      operator_delete(this_00,0x30);
    }
    else {
      ClusterList::append(clst,this_00);
    }
    b = b + 1;
  }
  return;
}

Assistant:

void
Cluster::distribute (ClusterList&     clst,
                     const BoxDomain& bd)
{
    BL_ASSERT(ok());
    BL_ASSERT(bd.ok());
    BL_ASSERT(clst.length() == 0);

    for (BoxDomain::const_iterator bdi = bd.begin(), End = bd.end();
         bdi != End && ok();
         ++bdi)
    {
        Cluster* c = new Cluster(*this, *bdi);

        if (c->ok())
            clst.append(c);
        else
            delete c;
    }
}